

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O0

bool __thiscall
UnifiedRegex::Matcher::MatchBOILiteral2
          (Matcher *this,Char *input,CharCount inputLength,CharCount offset,DWORD literal2)

{
  Program **ppPVar1;
  GroupInfo *pGVar2;
  GroupInfo *info;
  Program *program;
  DWORD literal2_local;
  CharCount offset_local;
  CharCount inputLength_local;
  Char *input_local;
  Matcher *this_local;
  
  if (((offset == 0) && (1 < inputLength)) &&
     (ppPVar1 = Memory::WriteBarrierPtr::operator_cast_to_Program__
                          ((WriteBarrierPtr *)&this->program),
     ((*ppPVar1)->rep).boiLiteral2.literal == *(Type *)input)) {
    pGVar2 = GroupIdToGroupInfo(this,0);
    pGVar2->offset = 0;
    pGVar2->length = 2;
    this_local._7_1_ = true;
  }
  else {
    ResetGroup(this,0);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

inline bool Matcher::MatchBOILiteral2(const Char* const input, const CharCount inputLength, CharCount offset, DWORD literal2)
    {
        if (offset == 0 && inputLength >= 2)
        {
            CompileAssert(sizeof(Char) == 2);
            const Program * program = this->program;
            if (program->rep.boiLiteral2.literal == *(DWORD *)input)
            {
                GroupInfo* const info = GroupIdToGroupInfo(0);
                info->offset = 0;
                info->length = 2;
                return true;
            }
        }
        ResetGroup(0);
        return false;
    }